

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INeuron.cpp
# Opt level: O1

void __thiscall INeuron::INeuron(INeuron *this,Potential _potential,Time _tRef,bool _isConsistent)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_INeuron = (_func_int **)&PTR___cxa_pure_virtual_00116998;
  p_Var1 = &(this->neighbours)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputSynapses)._M_h._M_buckets = &(this->inputSynapses)._M_h._M_single_bucket;
  (this->inputSynapses)._M_h._M_bucket_count = 1;
  (this->inputSynapses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputSynapses)._M_h._M_element_count = 0;
  (this->inputSynapses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputSynapses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputSynapses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->outputSynapses)._M_h._M_buckets = &(this->outputSynapses)._M_h._M_single_bucket;
  (this->outputSynapses)._M_h._M_bucket_count = 1;
  (this->outputSynapses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->outputSynapses)._M_h._M_element_count = 0;
  (this->outputSynapses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->outputSynapses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->outputSynapses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->potential = _potential;
  this->tRef = _tRef;
  this->consistent = _isConsistent;
  return;
}

Assistant:

INeuron::INeuron( SPIKING_NN::Potential _potential, SPIKING_NN::Time _tRef, bool _isConsistent ) :
        potential( _potential ), tRef( _tRef ), consistent( _isConsistent ) { }